

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Gia_ManCorrReduce_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  ulong uVar3;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar3 = (ulong)(uint)p->pReprs[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] &
          0xfffffff;
  if (uVar3 != 0xfffffff) {
    if (p->nObjs <= (int)uVar3) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pGVar1 != (Gia_Obj_t *)0x0) {
      pGVar1 = pGVar1 + uVar3;
      Gia_ManCorrReduce_rec(pNew,p,pGVar1);
      if ((int)pGVar1->Value < 0) goto LAB_0064b585;
      uVar2 = pGVar1->Value ^
              (uint)(((uint)((ulong)*(undefined8 *)((ulong)pGVar1 & 0xfffffffffffffffe) >> 0x3f) ^
                     (uint)pGVar1 & 1) !=
                    ((uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >> 0x3f) ^
                    (uint)pObj & 1));
      goto LAB_0064b557;
    }
  }
  if (pObj->Value != 0xffffffff) {
    return;
  }
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (uVar2 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar2 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                  ,0x2a1,"void Gia_ManCorrReduce_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  Gia_ManCorrReduce_rec(pNew,p,pObj + -(ulong)uVar2);
  Gia_ManCorrReduce_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
  uVar3 = *(ulong *)pObj;
  if (-1 < (int)pObj[-(uVar3 & 0x1fffffff)].Value) {
    uVar2 = (uint)(uVar3 >> 0x20);
    if (-1 < (int)pObj[-(ulong)(uVar2 & 0x1fffffff)].Value) {
      uVar2 = Gia_ManHashAnd(pNew,(uint)(uVar3 >> 0x1d) & 1 ^ pObj[-(uVar3 & 0x1fffffff)].Value,
                             pObj[-(ulong)(uVar2 & 0x1fffffff)].Value ^ uVar2 >> 0x1d & 1);
LAB_0064b557:
      pObj->Value = uVar2;
      return;
    }
  }
LAB_0064b585:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

void Gia_ManCorrReduce_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        Gia_ManCorrReduce_rec( pNew, p, pRepr );
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManCorrReduce_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}